

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# move.h
# Opt level: O3

void __thiscall Movegen::Movegen(Movegen *this,position *pos)

{
  Color CVar1;
  ulong uVar2;
  ulong uVar3;
  array<std::array<Square,_11UL>,_6UL> *paVar4;
  array<std::array<Square,_11UL>,_6UL> *paVar5;
  array<std::array<Square,_11UL>,_6UL> *paVar6;
  array<std::array<Square,_11UL>,_6UL> *paVar7;
  array<std::array<Square,_11UL>,_6UL> *paVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  piece_data *ppVar16;
  uint uVar17;
  bool bVar18;
  
  this->last = 0;
  lVar9 = 6;
  do {
    *(undefined2 *)((long)(this->list + -2) + lVar9) = 0;
    *(undefined1 *)((long)this->list + lVar9 + -4) = 0x11;
    lVar9 = lVar9 + 3;
  } while (lVar9 != 0x294);
  (this->queen_mvs).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->queen_mvs).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->rook_mvs).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->rook_mvs).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->bishop_mvs).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->rook_mvs).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->bishop_mvs).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->bishop_mvs).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar11 = 0;
  (this->queen_mvs).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  CVar1 = (pos->ifo).stm;
  uVar13 = (ulong)CVar1;
  this->us = CVar1;
  this->them = CVar1 ^ black;
  uVar10 = (pos->pcs).bycolor._M_elems[1] | (pos->pcs).bycolor._M_elems[0];
  this->all_pieces = uVar10;
  uVar10 = ~uVar10;
  this->empty = uVar10;
  uVar17 = 0xfffffff7;
  if (uVar13 == 0) {
    uVar17 = 0xfffffffd;
  }
  uVar15 = (uint)(pos->ifo).cmask;
  this->can_castle_ks = ((uint)(uVar13 == 0) * 3 - 5 | uVar15) == 0xffffffff;
  this->can_castle_qs = (uVar17 | uVar15) == 0xffffffff;
  uVar12 = (pos->ifo).checkers;
  this->check_target = uVar12;
  this->evasion_target = 0;
  if (uVar12 - 1 < (uVar12 ^ uVar12 - 1)) {
    lVar9 = 0;
    if (uVar12 != 0) {
      for (; (uVar12 >> lVar9 & 1) == 0; lVar9 = lVar9 + 1) {
      }
    }
    if ((pos->pcs).piece_on._M_elems[lVar9] - bishop < 3) {
      uVar11 = *(ulong *)(bitboards::between +
                         (ulong)(pos->ifo).ks[uVar13] * 8 + (ulong)(uint)((int)lVar9 << 9)) & uVar10
      ;
      this->evasion_target = uVar11;
    }
    else {
      uVar11 = 0;
    }
  }
  ppVar16 = &pos->pcs;
  if (uVar13 == 0) {
    ppVar16 = (piece_data *)((pos->pcs).bycolor._M_elems + 1);
  }
  paVar4 = (pos->pcs).square_of._M_elems + 1;
  if (uVar13 == 0) {
    paVar4 = (pos->pcs).square_of._M_elems;
  }
  paVar5 = (pos->pcs).square_of._M_elems + 1;
  if (uVar13 == 0) {
    paVar5 = (pos->pcs).square_of._M_elems;
  }
  paVar6 = (pos->pcs).square_of._M_elems + 1;
  if (uVar13 == 0) {
    paVar6 = (pos->pcs).square_of._M_elems;
  }
  paVar7 = (pos->pcs).square_of._M_elems + 1;
  if (uVar13 == 0) {
    paVar7 = (pos->pcs).square_of._M_elems;
  }
  bVar18 = uVar13 != 0;
  uVar14 = DAT_00141b78;
  uVar13 = DAT_00141ba0;
  if (!bVar18) {
    uVar14 = DAT_00141ba0;
    uVar13 = DAT_00141b78;
  }
  paVar8 = (pos->pcs).square_of._M_elems + 1;
  if (!bVar18) {
    paVar8 = (pos->pcs).square_of._M_elems;
  }
  this->rank2 = uVar13;
  this->rank7 = uVar14;
  uVar2 = (pos->pcs).bitmap._M_elems[bVar18]._M_elems[0];
  this->pawns = uVar2;
  uVar3 = (ppVar16->bycolor)._M_elems[0];
  this->knights = (Square *)((long)(paVar8->_M_elems + 1) + 4);
  this->bishops = (Square *)((long)(paVar7->_M_elems + 2) + 4);
  this->rooks = (Square *)((long)(paVar6->_M_elems + 3) + 4);
  this->queens = (Square *)((long)(paVar5->_M_elems + 4) + 4);
  this->kings = (Square *)((long)(paVar4->_M_elems + 5) + 4);
  if (uVar11 != 0) {
    uVar10 = uVar11;
  }
  this->enemies = uVar3;
  if (uVar12 == 0) {
    uVar12 = uVar3;
  }
  this->qtarget = uVar10;
  this->ctarget = uVar12;
  this->eps = (pos->ifo).eps;
  this->pawns2 = uVar13 & uVar2;
  this->pawns7 = uVar14 & uVar2;
  return;
}

Assistant:

Movegen(const position& pos) : last(0) { initialize(pos); }